

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O0

int xmlParseURISafe(char *str,xmlURIPtr *uriOut)

{
  xmlURIPtr uri_00;
  int ret;
  xmlURIPtr uri;
  xmlURIPtr *uriOut_local;
  char *str_local;
  
  if (uriOut == (xmlURIPtr *)0x0) {
    str_local._4_4_ = 1;
  }
  else {
    *uriOut = (xmlURIPtr)0x0;
    if (str == (char *)0x0) {
      str_local._4_4_ = 1;
    }
    else {
      uri_00 = xmlCreateURI();
      if (uri_00 == (xmlURIPtr)0x0) {
        str_local._4_4_ = -1;
      }
      else {
        str_local._4_4_ = xmlParse3986URIReference(uri_00,str);
        if (str_local._4_4_ == 0) {
          *uriOut = uri_00;
          str_local._4_4_ = 0;
        }
        else {
          xmlFreeURI(uri_00);
        }
      }
    }
  }
  return str_local._4_4_;
}

Assistant:

int
xmlParseURISafe(const char *str, xmlURIPtr *uriOut) {
    xmlURIPtr uri;
    int ret;

    if (uriOut == NULL)
        return(1);
    *uriOut = NULL;
    if (str == NULL)
	return(1);

    uri = xmlCreateURI();
    if (uri == NULL)
        return(-1);

    ret = xmlParse3986URIReference(uri, str);
    if (ret) {
        xmlFreeURI(uri);
        return(ret);
    }

    *uriOut = uri;
    return(0);
}